

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool anon_unknown.dwarf_1da79e::extract_tar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,bool verbose,bool extract)

{
  archive *paVar1;
  bool bVar2;
  wchar_t wVar3;
  char *pcVar4;
  bool local_319;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  wchar_t local_1f4;
  char *pcStack_1f0;
  int ar;
  char *p;
  undefined1 local_1e0 [7];
  bool error_occured;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  allocator<char> local_199;
  string local_198;
  string local_178;
  allocator<char> local_151;
  string local_150;
  string local_130;
  allocator<char> local_109;
  string local_108;
  wchar_t local_e4;
  undefined1 local_e0 [4];
  int r;
  reference local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_98;
  archive *local_78;
  archive *matching;
  archive_entry *entry;
  archive *ext;
  archive *local_50;
  archive *a;
  cmLocaleRAII localeRAII;
  bool extract_local;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *outFileName_local;
  
  localeRAII.OldLocale.field_2._M_local_buf[0xe] = extract;
  localeRAII.OldLocale.field_2._M_local_buf[0xf] = verbose;
  cmLocaleRAII::cmLocaleRAII((cmLocaleRAII *)&a);
  local_50 = archive_read_new();
  entry = (archive_entry *)archive_write_disk_new();
  archive_read_support_filter_all(local_50);
  archive_read_support_format_all(local_50);
  local_78 = archive_match_new();
  if (local_78 == (archive *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Out of memory",(allocator<char> *)((long)&__range1 + 7));
    cmSystemTools::Error(&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    outFileName_local._7_1_ = false;
  }
  else {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
    filename = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&filename), paVar1 = local_50, bVar2) {
      local_c0 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      paVar1 = local_78;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      wVar3 = archive_match_include_pattern(paVar1,pcVar4);
      if (wVar3 != L'\0') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0
                       ,"Failed to add to inclusion list: ",local_c0);
        cmSystemTools::Error((string *)local_e0);
        std::__cxx11::string::~string((string *)local_e0);
        outFileName_local._7_1_ = false;
        goto LAB_0024c06a;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_e4 = cm_archive_read_open_file(paVar1,pcVar4,0x2800);
    if (local_e4 == L'\0') {
      local_e4 = L'\0';
      while (local_e4 = archive_read_next_header(local_50,(archive_entry **)&matching),
            local_e4 != L'\x01') {
        if (local_e4 != L'\0') {
          ArchiveError("Problem with archive_read_next_header(): ",local_50);
          break;
        }
        wVar3 = archive_match_excluded(local_78,(archive_entry *)matching);
        if (wVar3 == L'\0') {
          if ((localeRAII.OldLocale.field_2._M_local_buf[0xf] & 1U) == 0) {
            if ((localeRAII.OldLocale.field_2._M_local_buf[0xe] & 1U) == 0) {
              cm_archive_entry_pathname_abi_cxx11_(&local_178,(archive_entry *)matching);
              cmSystemTools::Stdout(&local_178);
              std::__cxx11::string::~string((string *)&local_178);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_198,"\n",&local_199);
              cmSystemTools::Stdout(&local_198);
              std::__cxx11::string::~string((string *)&local_198);
              std::allocator<char>::~allocator(&local_199);
            }
          }
          else {
            if ((localeRAII.OldLocale.field_2._M_local_buf[0xe] & 1U) == 0) {
              list_item_verbose(_stdout,(archive_entry *)matching);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_108,"x ",&local_109);
              cmSystemTools::Stdout(&local_108);
              std::__cxx11::string::~string((string *)&local_108);
              std::allocator<char>::~allocator(&local_109);
              cm_archive_entry_pathname_abi_cxx11_(&local_130,(archive_entry *)matching);
              cmSystemTools::Stdout(&local_130);
              std::__cxx11::string::~string((string *)&local_130);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"\n",&local_151)
            ;
            cmSystemTools::Stdout(&local_150);
            std::__cxx11::string::~string((string *)&local_150);
            std::allocator<char>::~allocator(&local_151);
          }
          if ((localeRAII.OldLocale.field_2._M_local_buf[0xe] & 1U) != 0) {
            local_e4 = archive_write_disk_set_options((archive *)entry,L'\x04');
            if (local_e4 != L'\0') {
              ArchiveError("Problem with archive_write_disk_set_options(): ",(archive *)entry);
              break;
            }
            local_e4 = archive_write_header((archive *)entry,(archive_entry *)matching);
            if (local_e4 != L'\0') {
              ArchiveError("Problem with archive_write_header(): ",(archive *)entry);
              cm_archive_entry_pathname_abi_cxx11_((string *)local_1e0,(archive_entry *)matching);
              std::operator+(&local_1c0,"Current file: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e0);
              cmSystemTools::Error(&local_1c0);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::__cxx11::string::~string((string *)local_1e0);
              break;
            }
            bVar2 = copy_data(local_50,(archive *)entry);
            if (!bVar2) break;
            local_e4 = archive_write_finish_entry((archive *)entry);
            if (local_e4 != L'\0') {
              ArchiveError("Problem with archive_write_finish_entry(): ",(archive *)entry);
              break;
            }
            local_e4 = L'\0';
          }
        }
      }
      p._7_1_ = 0;
      if (local_78 != (archive *)0x0) {
        while (local_1f4 = archive_match_path_unmatched_inclusions_next
                                     (local_78,&stack0xfffffffffffffe10), pcVar4 = pcStack_1f0,
              local_1f4 == L'\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,pcVar4,&local_259)
          ;
          std::operator+(&local_238,"tar: ",&local_258);
          std::operator+(&local_218,&local_238,": Not found in archive");
          cmSystemTools::Error(&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          std::__cxx11::string::~string((string *)&local_238);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator(&local_259);
          p._7_1_ = 1;
        }
        if ((p._7_1_ & 1) != 0) {
          outFileName_local._7_1_ = false;
          goto LAB_0024c06a;
        }
        if (local_1f4 == L'\xffffffe2') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_280,"tar: Out of memory",&local_281);
          cmSystemTools::Error(&local_280);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          outFileName_local._7_1_ = false;
          goto LAB_0024c06a;
        }
      }
      archive_match_free(local_78);
      archive_write_free((archive *)entry);
      archive_read_close(local_50);
      archive_read_free(local_50);
      local_319 = (uint)local_e4 < 2;
      outFileName_local._7_1_ = local_319;
    }
    else {
      ArchiveError("Problem with archive_read_open_file(): ",local_50);
      archive_write_free((archive *)entry);
      archive_read_close(local_50);
      outFileName_local._7_1_ = false;
    }
  }
LAB_0024c06a:
  __range1._0_4_ = 1;
  cmLocaleRAII::~cmLocaleRAII((cmLocaleRAII *)&a);
  return outFileName_local._7_1_;
}

Assistant:

bool extract_tar(const std::string& outFileName,
                 const std::vector<std::string>& files, bool verbose,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive* ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry* entry;

  struct archive* matching = archive_match_new();
  if (matching == nullptr) {
    cmSystemTools::Error("Out of memory");
    return false;
  }

  for (const auto& filename : files) {
    if (archive_match_include_pattern(matching, filename.c_str()) !=
        ARCHIVE_OK) {
      cmSystemTools::Error("Failed to add to inclusion list: " + filename);
      return false;
    }
  }

  int r = cm_archive_read_open_file(a, outFileName.c_str(), 10240);
  if (r) {
    ArchiveError("Problem with archive_read_open_file(): ", a);
    archive_write_free(ext);
    archive_read_close(a);
    return false;
  }
  for (;;) {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF) {
      break;
    }
    if (r != ARCHIVE_OK) {
      ArchiveError("Problem with archive_read_next_header(): ", a);
      break;
    }

    if (archive_match_excluded(matching, entry)) {
      continue;
    }

    if (verbose) {
      if (extract) {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      } else {
        list_item_verbose(stdout, entry);
      }
      cmSystemTools::Stdout("\n");
    } else if (!extract) {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      cmSystemTools::Stdout("\n");
    }
    if (extract) {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK) {
        ArchiveError("Problem with archive_write_disk_set_options(): ", ext);
        break;
      }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK) {
        if (!copy_data(a, ext)) {
          break;
        }
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_finish_entry(): ", ext);
          break;
        }
      }
#  ifdef _WIN32
      else if (const char* linktext = archive_entry_symlink(entry)) {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry) << "\" -> \"" << linktext
                  << "\"." << std::endl;
      }
#  endif
      else {
        ArchiveError("Problem with archive_write_header(): ", ext);
        cmSystemTools::Error("Current file: " +
                             cm_archive_entry_pathname(entry));
        break;
      }
    }
  }